

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

PostDominatorAnalysis * __thiscall
spvtools::opt::IRContext::GetPostDominatorAnalysis(IRContext *this,Function *f)

{
  bool bVar1;
  CFG *cfg;
  mapped_type *pmVar2;
  _Self local_28;
  _Self local_20;
  Function *local_18;
  Function *f_local;
  IRContext *this_local;
  
  local_18 = f;
  f_local = (Function *)this;
  bVar1 = AreAnalysesValid(this,kAnalysisDominatorAnalysis);
  if (!bVar1) {
    ResetDominatorAnalysis(this);
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
       ::find(&this->post_dominator_trees_,&local_18);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
       ::end(&this->post_dominator_trees_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    pmVar2 = std::
             map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
             ::operator[](&this->post_dominator_trees_,&local_18);
    cfg = IRContext::cfg(this);
    DominatorAnalysisBase::InitializeTree(&pmVar2->super_DominatorAnalysisBase,cfg,local_18);
  }
  pmVar2 = std::
           map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
           ::operator[](&this->post_dominator_trees_,&local_18);
  return pmVar2;
}

Assistant:

PostDominatorAnalysis* IRContext::GetPostDominatorAnalysis(const Function* f) {
  if (!AreAnalysesValid(kAnalysisDominatorAnalysis)) {
    ResetDominatorAnalysis();
  }

  if (post_dominator_trees_.find(f) == post_dominator_trees_.end()) {
    post_dominator_trees_[f].InitializeTree(*cfg(), f);
  }

  return &post_dominator_trees_[f];
}